

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O0

void fetch_linear_gradient(uint32_t *buffer,Operator *op,VSpanData *data,int y,int x,int length)

{
  bool bVar1;
  uint32_t value;
  Spread SVar2;
  VGradientData *pVVar3;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  VGradientData *in_RDI;
  int in_R8D;
  int in_R9D;
  float yt;
  float xt;
  float rw;
  int inc_fixed;
  int t_fixed;
  uint32_t *end;
  float ry;
  float rx;
  bool affine;
  VGradientData *gradient;
  float inc;
  float t;
  float in_stack_ffffffffffffff8c;
  VGradientData *in_stack_ffffffffffffff90;
  float local_5c;
  float local_2c;
  float local_28;
  VGradientData *local_8;
  
  bVar1 = true;
  if ((*(float *)(in_RSI + 0x28) != 0.0) || (NAN(*(float *)(in_RSI + 0x28)))) {
    local_28 = *(float *)(in_RSI + 0x20) *
               (*(float *)(in_RDX + 0xd4) * ((float)in_ECX + 0.5) +
                *(float *)(in_RDX + 200) * ((float)in_R8D + 0.5) + *(float *)(in_RDX + 0xe4)) +
               *(float *)(in_RSI + 0x24) *
               (*(float *)(in_RDX + 0xd8) * ((float)in_ECX + 0.5) +
                *(float *)(in_RDX + 0xcc) * ((float)in_R8D + 0.5) + *(float *)(in_RDX + 0xe8)) +
               *(float *)(in_RSI + 0x2c);
    local_2c = *(float *)(in_RSI + 0x20) * *(float *)(in_RDX + 200) +
               *(float *)(in_RSI + 0x24) * *(float *)(in_RDX + 0xcc);
    bVar1 = false;
    if ((*(float *)(in_RDX + 0xd0) == 0.0) && (!NAN(*(float *)(in_RDX + 0xd0)))) {
      bVar1 = *(float *)(in_RDX + 0xdc) == 0.0;
    }
    if (bVar1) {
      local_28 = local_28 * 1023.0;
      local_2c = local_2c * 1023.0;
    }
  }
  else {
    local_2c = 0.0;
    local_28 = 0.0;
  }
  pVVar3 = (VGradientData *)(&in_RDI->mSpread + in_R9D);
  local_8 = in_RDI;
  if (bVar1) {
    if ((local_2c <= -1e-05) || (1e-05 <= local_2c)) {
      if ((4194303.0 <= local_2c * (float)in_R9D + local_28) ||
         (local_2c * (float)in_R9D + local_28 <= -4194304.0)) {
        for (; local_8 < pVVar3; local_8 = (VGradientData *)&local_8->field_1) {
          SVar2 = gradientPixel(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
          local_8->mSpread = SVar2;
        }
      }
      else {
        for (; local_8 < pVVar3; local_8 = (VGradientData *)&local_8->field_1) {
          SVar2 = gradientPixelFixed(in_stack_ffffffffffffff90,(int)in_stack_ffffffffffffff8c);
          local_8->mSpread = SVar2;
        }
      }
    }
    else {
      value = gradientPixelFixed(in_RDI,(int)in_stack_ffffffffffffff8c);
      memfill32(&in_RDI->mSpread,value,in_R9D);
    }
  }
  else {
    local_5c = *(float *)(in_RDX + 0xdc) * ((float)in_ECX + 0.5) +
               *(float *)(in_RDX + 0xd0) * ((float)in_R8D + 0.5) + *(float *)(in_RDX + 0xe0);
    for (; local_8 < pVVar3; local_8 = (VGradientData *)&local_8->field_1) {
      SVar2 = gradientPixel(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      local_8->mSpread = SVar2;
      local_5c = *(float *)(in_RDX + 0xd0) + local_5c;
      if ((local_5c == 0.0) && (!NAN(local_5c))) {
        local_5c = *(float *)(in_RDX + 0xd0) + local_5c;
      }
    }
  }
  return;
}

Assistant:

void fetch_linear_gradient(uint32_t *buffer, const Operator *op,
                           const VSpanData *data, int y, int x, int length)
{
    float                t, inc;
    const VGradientData *gradient = &data->mGradient;

    bool  affine = true;
    float rx = 0, ry = 0;
    if (op->linear.l == 0) {
        t = inc = 0;
    } else {
        rx = data->m21 * (y + float(0.5)) + data->m11 * (x + float(0.5)) +
             data->dx;
        ry = data->m22 * (y + float(0.5)) + data->m12 * (x + float(0.5)) +
             data->dy;
        t = op->linear.dx * rx + op->linear.dy * ry + op->linear.off;
        inc = op->linear.dx * data->m11 + op->linear.dy * data->m12;
        affine = !data->m13 && !data->m23;

        if (affine) {
            t *= (VGradient::colorTableSize - 1);
            inc *= (VGradient::colorTableSize - 1);
        }
    }

    const uint32_t *end = buffer + length;
    if (affine) {
        if (inc > float(-1e-5) && inc < float(1e-5)) {
            memfill32(buffer, gradientPixelFixed(gradient, int(t * FIXPT_SIZE)),
                      length);
        } else {
            if (t + inc * length < float(INT_MAX >> (FIXPT_BITS + 1)) &&
                t + inc * length > float(INT_MIN >> (FIXPT_BITS + 1))) {
                // we can use fixed point math
                int t_fixed = int(t * FIXPT_SIZE);
                int inc_fixed = int(inc * FIXPT_SIZE);
                while (buffer < end) {
                    *buffer = gradientPixelFixed(gradient, t_fixed);
                    t_fixed += inc_fixed;
                    ++buffer;
                }
            } else {
                // we have to fall back to float math
                while (buffer < end) {
                    *buffer =
                        gradientPixel(gradient, t / VGradient::colorTableSize);
                    t += inc;
                    ++buffer;
                }
            }
        }
    } else {  // fall back to float math here as well
        float rw = data->m23 * (y + float(0.5)) + data->m13 * (x + float(0.5)) +
                   data->m33;
        while (buffer < end) {
            float xt = rx / rw;
            float yt = ry / rw;
            t = (op->linear.dx * xt + op->linear.dy * yt) + op->linear.off;

            *buffer = gradientPixel(gradient, t);
            rx += data->m11;
            ry += data->m12;
            rw += data->m13;
            if (!rw) {
                rw += data->m13;
            }
            ++buffer;
        }
    }
}